

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int RunAddRoute(string *remote,Commandline *args)

{
  initializer_list<bhf::ParameterOption> list;
  int iVar1;
  undefined8 uVar2;
  ParameterOption *local_5f0;
  undefined2 uStack_572;
  string local_570 [39];
  allocator local_549;
  string local_548 [32];
  undefined1 local_528 [71];
  allocator local_4e1;
  string local_4e0 [32];
  undefined1 local_4c0 [71];
  allocator local_479;
  string local_478 [32];
  undefined1 local_458 [71];
  allocator local_411;
  string local_410 [32];
  undefined1 local_3f0 [71];
  allocator local_3a9;
  string local_3a8 [32];
  undefined1 local_388 [40];
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [55];
  allocator local_1e9;
  string local_1e8 [32];
  ParameterOption *local_1c8;
  ParameterOption local_1c0;
  ParameterOption local_178;
  ParameterOption local_130;
  ParameterOption local_e8;
  ParameterOption local_a0;
  iterator local_58;
  undefined8 local_50;
  undefined1 local_48 [8];
  ParameterList params;
  Commandline *args_local;
  string *remote_local;
  
  local_388[0x26] = 1;
  local_1c8 = &local_1c0;
  params.map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)args;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"--addr",&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"",&local_221);
  bhf::ParameterOption::ParameterOption(&local_1c0,(string *)local_1e8,false,(string *)local_220);
  local_1c8 = &local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"--netid",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"",&local_271);
  bhf::ParameterOption::ParameterOption(&local_178,(string *)local_248,false,(string *)local_270);
  local_1c8 = &local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"--password",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"",&local_2c1);
  bhf::ParameterOption::ParameterOption(&local_130,(string *)local_298,false,(string *)local_2c0);
  local_1c8 = &local_e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"--username",&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"Administrator",&local_311);
  bhf::ParameterOption::ParameterOption(&local_e8,(string *)local_2e8,false,(string *)local_310);
  local_1c8 = &local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"--routename",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"",(allocator *)(local_388 + 0x27));
  bhf::ParameterOption::ParameterOption(&local_a0,(string *)local_338,false,(string *)local_360);
  local_388[0x26] = 0;
  local_58 = &local_1c0;
  local_50 = 5;
  list._M_len = 5;
  list._M_array = local_58;
  bhf::ParameterList::ParameterList((ParameterList *)local_48,list);
  local_5f0 = (ParameterOption *)&local_58;
  do {
    local_5f0 = local_5f0 + -1;
    bhf::ParameterOption::~ParameterOption(local_5f0);
  } while (local_5f0 != &local_1c0);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)(local_388 + 0x27));
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  bhf::Commandline::Parse
            ((ParameterList *)params.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"--netid",&local_3a9);
  std::__cxx11::string::string((string *)(local_3f0 + 0x20));
  bhf::ParameterList::Get<std::__cxx11::string>
            ((ParameterList *)local_388,(string *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8);
  uVar2 = make_AmsNetId((string *)local_388);
  local_388._32_4_ = (undefined4)uVar2;
  local_388._36_2_ = (undefined2)((ulong)uVar2 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"--addr",&local_411);
  std::__cxx11::string::string((string *)(local_458 + 0x20));
  bhf::ParameterList::Get<std::__cxx11::string>
            ((ParameterList *)local_3f0,(string *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"--routename",&local_479);
  std::__cxx11::string::string((string *)(local_4c0 + 0x20));
  bhf::ParameterList::Get<std::__cxx11::string>
            ((ParameterList *)local_458,(string *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e0,"--username",&local_4e1);
  std::__cxx11::string::string((string *)(local_528 + 0x20));
  bhf::ParameterList::Get<std::__cxx11::string>
            ((ParameterList *)local_4c0,(string *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"--password",&local_549);
  std::__cxx11::string::string(local_570);
  bhf::ParameterList::Get<std::__cxx11::string>
            ((ParameterList *)local_528,(string *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548);
  iVar1 = bhf::ads::AddRemoteRoute
                    (remote,CONCAT26(uStack_572,CONCAT24(local_388._36_2_,local_388._32_4_)),
                     local_3f0,local_458,local_4c0,local_528);
  std::__cxx11::string::~string((string *)local_528);
  std::__cxx11::string::~string(local_570);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  std::__cxx11::string::~string((string *)local_4c0);
  std::__cxx11::string::~string((string *)(local_528 + 0x20));
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  std::__cxx11::string::~string((string *)local_458);
  std::__cxx11::string::~string((string *)(local_4c0 + 0x20));
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  std::__cxx11::string::~string((string *)local_3f0);
  std::__cxx11::string::~string((string *)(local_458 + 0x20));
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  std::__cxx11::string::~string((string *)local_388);
  std::__cxx11::string::~string((string *)(local_3f0 + 0x20));
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  bhf::ParameterList::~ParameterList((ParameterList *)local_48);
  return iVar1;
}

Assistant:

int RunAddRoute(const std::string& remote, bhf::Commandline& args)
{
    bhf::ParameterList params = {
        {"--addr"},
        {"--netid"},
        {"--password"},
        {"--username", false, "Administrator"},
        {"--routename"},
    };
    args.Parse(params);

    return bhf::ads::AddRemoteRoute(remote,
                                    make_AmsNetId(params.Get<std::string>("--netid")),
                                    params.Get<std::string>("--addr"),
                                    params.Get<std::string>("--routename"),
                                    params.Get<std::string>("--username"),
                                    params.Get<std::string>("--password")
                                    );
}